

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_BrowseResult *
UA_Server_browseNext
          (UA_BrowseResult *__return_storage_ptr__,UA_Server *server,
          UA_Boolean releaseContinuationPoint,UA_ByteString *continuationPoint)

{
  UA_BrowseResult *result;
  UA_ByteString *continuationPoint_local;
  UA_Boolean releaseContinuationPoint_local;
  UA_Server *server_local;
  
  UA_BrowseResult_init(__return_storage_ptr__);
  UA_Server_browseNext_single
            (server,&adminSession,releaseContinuationPoint,continuationPoint,__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

UA_BrowseResult
UA_Server_browseNext(UA_Server *server, UA_Boolean releaseContinuationPoint,
                     const UA_ByteString *continuationPoint) {
    UA_BrowseResult result;
    UA_BrowseResult_init(&result);
    UA_RCU_LOCK();
    UA_Server_browseNext_single(server, &adminSession, releaseContinuationPoint,
                                continuationPoint, &result);
    UA_RCU_UNLOCK();
    return result;
}